

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_server.hpp
# Opt level: O0

error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
* __thiscall
pstore::http::
send_message<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
          (error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
           *__return_storage_ptr__,http *this,
          _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
          *sender,reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                  io,opcode op,span<const_unsigned_char,__1L> *span)

{
  unsigned_short uVar1;
  ulong uVar2;
  reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_> io_00;
  undefined4 in_register_00000084;
  frame_fixed_layout *pfVar3;
  anon_class_16_2_9095cc0e f_00;
  error_code eVar4;
  error_code erc;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_68;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  *local_50;
  frame_fixed_layout *local_48;
  ulong local_40;
  index_type length;
  frame_fixed_layout *pfStack_30;
  frame_fixed_layout f;
  span<const_unsigned_char,__1L> *span_local;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  *peStack_20;
  opcode op_local;
  _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
  *sender_local;
  reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_> io_local
  ;
  
  pfVar3 = (frame_fixed_layout *)CONCAT44(in_register_00000084,op);
  span_local._4_4_ = SUB84(io._M_data,0);
  pfStack_30 = pfVar3;
  peStack_20 = (error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
                *)this;
  sender_local = sender;
  io_local._M_data = (descriptor<pstore::details::posix_descriptor_traits> *)__return_storage_ptr__;
  memset((void *)((long)&length + 6),0,2);
  bit_field<unsigned_short,_15U,_1U>::operator=
            ((bit_field<unsigned_short,_15U,_1U> *)((long)&length + 6),true);
  bit_field<unsigned_short,12u,3u>::operator=
            ((bit_field<unsigned_short,12u,3u> *)((long)&length + 6),0);
  bit_field<unsigned_short,8u,4u>::operator=
            ((bit_field<unsigned_short,8u,4u> *)((long)&length + 6),(unsigned_short)span_local._4_4_
            );
  bit_field<unsigned_short,_7U,_1U>::operator=
            ((bit_field<unsigned_short,_7U,_1U> *)((long)&length + 6),false);
  uVar2 = pstore::gsl::span<const_unsigned_char,_-1L>::size
                    ((span<const_unsigned_char,__1L> *)&pfStack_30->payload_length);
  local_40 = uVar2;
  if ((long)uVar2 < 0x7e) {
    local_40._0_2_ = (unsigned_short)uVar2;
    uVar1 = (unsigned_short)local_40;
    bit_field<unsigned_short,0u,7u>::operator=
              ((bit_field<unsigned_short,0u,7u> *)((long)&length + 6),uVar1);
    local_50 = peStack_20;
    local_48 = pfStack_30;
    io_00._M_data._2_6_ = 0;
    io_00._M_data._0_2_ = length._6_2_;
    send<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,unsigned_short,void>
              (&local_68,(http *)peStack_20,sender_local,io_00,(unsigned_short)pfVar3);
    f_00.span = (span<const_unsigned_char,__1L> *)pfVar3;
    f_00.sender = (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                   *)local_48;
    pstore::operator>>=(__return_storage_ptr__,(pstore *)&local_68,local_50,f_00);
    error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
    ::~error_or(&local_68);
  }
  else {
    uVar1 = std::numeric_limits<unsigned_short>::max();
    if ((long)(ulong)uVar1 < (long)uVar2) {
      if ((local_40 & 0x8000000000000000) == 0) {
        bit_field<unsigned_short,0u,7u>::operator=
                  ((bit_field<unsigned_short,0u,7u> *)((long)&length + 6),0x7f);
        details::
        send_extended_length_message<unsigned_long,pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                  (__return_storage_ptr__,(details *)peStack_20,sender_local,
                   (descriptor<pstore::details::posix_descriptor_traits> *)((long)&length + 6),
                   pfStack_30,span);
      }
      else {
        eVar4 = make_error_code(message_too_long);
        erc._M_cat = eVar4._M_cat;
        erc._4_4_ = 0;
        erc._M_value = eVar4._M_value;
        error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
        ::error_or(__return_storage_ptr__,erc);
      }
    }
    else {
      bit_field<unsigned_short,0u,7u>::operator=
                ((bit_field<unsigned_short,0u,7u> *)((long)&length + 6),0x7e);
      details::
      send_extended_length_message<unsigned_short,pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                (__return_storage_ptr__,(details *)peStack_20,sender_local,
                 (descriptor<pstore::details::posix_descriptor_traits> *)((long)&length + 6),
                 pfStack_30,span);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

error_or<IO> send_message (Sender const sender, IO const io, opcode const op,
                                   gsl::span<std::uint8_t const> const & span) {
            frame_fixed_layout f{};
            f.fin = true;
            f.rsv = std::uint16_t{0};
            f.opcode = static_cast<std::uint16_t> (op);
            f.mask = false;

            auto const length = span.size ();
            if (length < 126) {
                f.payload_length = static_cast<std::uint16_t> (length);
                return send (sender, io, f.raw) >>=
                       [sender, &span] (IO io2) { return send (sender, io2, span); };
            }

            if (length <= std::numeric_limits<std::uint16_t>::max ()) {
                // Length is sent as 16-bits.
                f.payload_length = std::uint16_t{126};
                return details::send_extended_length_message<std::uint16_t> (sender, io, f, span);
            }

            // The payload length must not have the top bit set.
            if (static_cast<std::uint64_t> (length) & (std::uint64_t{1} << 63U)) {
                return error_or<IO>{make_error_code (ws_error::message_too_long)};
            }

            // Send the length as a full 64-bit value.
            f.payload_length = std::uint16_t{127};
            return details::send_extended_length_message<std::uint64_t> (sender, io, f, span);
        }